

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

void Gia_ManAreCubeAddToTree_rec(Gia_ManAre_t *p,Gia_ObjAre_t *pObj,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t *pGVar1;
  uint **ppuVar2;
  Gia_PtrAre_t GVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  
  do {
    uVar6 = *(uint *)pObj;
    uVar8 = *(uint *)(&pSta[1].iPrev.field_0x0 + (uVar6 >> 2 & 0xffc));
    uVar5 = uVar6 * 2 & 0x1e;
    if ((uVar8 >> uVar5 & 1) == 0) {
      if ((uVar8 >> (sbyte)uVar5 & 2) == 0) {
        if ((0x3ffffff < uVar6) || (((uint)pObj->F[2] & 0x7fffffff) == 0)) {
          pSta->iNext = pObj->F[2];
          uVar4 = (long)p->nStas - 1;
          GVar3 = SUB84(uVar4,0);
          pObj->F[2] = GVar3;
          uVar8 = (uint)(uVar4 >> 0x14) & 0x7ff;
          uVar6 = (uint)GVar3 & 0xfffff;
          if ((Gia_StaAre_t *)(p->ppStas[uVar8] + (long)p->nSize * (ulong)uVar6) == pSta) {
            uVar7 = (*(uint *)pObj >> 0x1a) + 1;
            uVar5 = *(uint *)pObj & 0x3ffffff;
            *(uint *)pObj = uVar7 * 0x4000000 | uVar5;
            if ((~uVar7 & 0x3f) != 0) {
              return;
            }
            ppuVar2 = p->ppStas;
            uVar7 = 0;
            for (puVar9 = ppuVar2[uVar8] + (int)(uVar6 * p->nSize); *ppuVar2 != puVar9;
                puVar9 = (uint *)((long)(int)((puVar9[1] & 0xfffff) * p->nSize) * 4 +
                                 *(long *)((long)ppuVar2 + (ulong)(puVar9[1] >> 0x11 & 0x3ff8)))) {
              uVar7 = uVar7 - ((int)~*puVar9 >> 0x1f);
            }
            *(uint *)pObj = uVar7 << 0x1a | uVar5;
            if (0x1e < (uVar7 & 0x3f)) {
              Gia_ManAreRebalance(p,pObj->F + 2);
              pObj->field_0x3 = pObj->field_0x3 & 3;
              return;
            }
            Gia_ManAreCompress(p,pObj->F + 2);
            return;
          }
          goto LAB_0072b16a;
        }
        GVar3 = pObj->F[2];
      }
      else {
        if (((uVar6 & 0x3f00000) != 0) || (((uint)pObj->F[1] & 0x7fffffff) == 0)) {
          pSta->iNext = pObj->F[1];
          uVar4 = (long)p->nStas - 1;
          GVar3 = SUB84(uVar4,0);
          pObj->F[1] = GVar3;
          uVar6 = (uint)(uVar4 >> 0x14) & 0x7ff;
          uVar8 = (uint)GVar3 & 0xfffff;
          if ((Gia_StaAre_t *)(p->ppStas[uVar6] + (long)p->nSize * (ulong)uVar8) == pSta) {
            uVar7 = (*(uint *)pObj >> 0x14) + 1 & 0x3f;
            uVar5 = *(uint *)pObj & 0xfc0fffff;
            *(uint *)pObj = uVar7 << 0x14 | uVar5;
            if (uVar7 != 0x3f) {
              return;
            }
            ppuVar2 = p->ppStas;
            uVar7 = 0;
            for (puVar9 = ppuVar2[uVar6] + (int)(p->nSize * uVar8); *ppuVar2 != puVar9;
                puVar9 = (uint *)((long)(int)((puVar9[1] & 0xfffff) * p->nSize) * 4 +
                                 *(long *)((long)ppuVar2 + (ulong)(puVar9[1] >> 0x11 & 0x3ff8)))) {
              uVar7 = uVar7 - ((int)~*puVar9 >> 0x1f);
            }
            pGVar1 = pObj->F + 1;
            *(uint *)pObj = (uVar7 & 0x3f) << 0x14 | uVar5;
            if (0x1e < (uVar7 & 0x3f)) {
              Gia_ManAreRebalance(p,pGVar1);
              *(uint *)pObj = *(uint *)pObj & 0xfc0fffff;
              return;
            }
            if ((uVar4 & 0x7fffffff) != 0) {
              *pGVar1 = (Gia_PtrAre_t)((uint)GVar3 & 0x80000000);
              puVar9 = p->ppStas[uVar6] + (ulong)uVar8 * (long)p->nSize;
              if (*p->ppStas == puVar9) {
                return;
              }
              do {
                uVar6 = puVar9[1];
                if (-1 < (int)*puVar9) {
                  *(Gia_PtrAre_t *)(puVar9 + 1) = *pGVar1;
                  *pGVar1 = SUB84(uVar4,0);
                }
                puVar9 = (uint *)((long)p->nSize * (ulong)(uVar6 & 0xfffff) * 4 +
                                 *(long *)((long)p->ppStas + (ulong)(uVar6 >> 0x11 & 0x3ff8)));
                uVar4 = (ulong)uVar6;
              } while (*p->ppStas != puVar9);
              return;
            }
            goto LAB_0072b189;
          }
          goto LAB_0072b16a;
        }
        GVar3 = pObj->F[1];
      }
    }
    else {
      if (((uVar6 & 0xfc000) != 0) || (((uint)pObj->F[0] & 0x7fffffff) == 0)) {
        pSta->iNext = pObj->F[0];
        uVar4 = (long)p->nStas - 1;
        GVar3 = SUB84(uVar4,0);
        pObj->F[0] = GVar3;
        uVar6 = (uint)(uVar4 >> 0x14) & 0x7ff;
        uVar8 = (uint)GVar3 & 0xfffff;
        if ((Gia_StaAre_t *)(p->ppStas[uVar6] + (long)p->nSize * (ulong)uVar8) == pSta) {
          uVar7 = (*(uint *)pObj >> 0xe) + 1 & 0x3f;
          uVar5 = *(uint *)pObj & 0xfff03fff;
          *(uint *)pObj = uVar7 << 0xe | uVar5;
          if (uVar7 == 0x3f) {
            ppuVar2 = p->ppStas;
            uVar7 = 0;
            for (puVar9 = ppuVar2[uVar6] + (int)(p->nSize * uVar8); *ppuVar2 != puVar9;
                puVar9 = (uint *)((long)(int)((puVar9[1] & 0xfffff) * p->nSize) * 4 +
                                 *(long *)((long)ppuVar2 + (ulong)(puVar9[1] >> 0x11 & 0x3ff8)))) {
              uVar7 = uVar7 - ((int)~*puVar9 >> 0x1f);
            }
            pGVar1 = pObj->F;
            *(uint *)pObj = (uVar7 & 0x3f) << 0xe | uVar5;
            if ((uVar7 & 0x3f) < 0x1f) {
              if ((uVar4 & 0x7fffffff) == 0) {
LAB_0072b189:
                __assert_fail("pRoot->nItem || pRoot->nPage",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                              ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
              }
              *pGVar1 = (Gia_PtrAre_t)((uint)GVar3 & 0x80000000);
              puVar9 = p->ppStas[uVar6] + (ulong)uVar8 * (long)p->nSize;
              if (*p->ppStas != puVar9) {
                do {
                  uVar6 = puVar9[1];
                  if (-1 < (int)*puVar9) {
                    *(Gia_PtrAre_t *)(puVar9 + 1) = *pGVar1;
                    *pGVar1 = SUB84(uVar4,0);
                  }
                  puVar9 = (uint *)((long)p->nSize * (ulong)(uVar6 & 0xfffff) * 4 +
                                   *(long *)((long)p->ppStas + (ulong)(uVar6 >> 0x11 & 0x3ff8)));
                  uVar4 = (ulong)uVar6;
                } while (*p->ppStas != puVar9);
              }
            }
            else {
              Gia_ManAreRebalance(p,pGVar1);
              *(uint *)pObj = *(uint *)pObj & 0xfff03fff;
            }
          }
          return;
        }
LAB_0072b16a:
        __assert_fail("pSta == Gia_ManAreSta(p, *pRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                      ,0x415,
                      "void Gia_ManAreCubeAddToList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                     );
      }
      GVar3 = pObj->F[0];
    }
    pObj = (Gia_ObjAre_t *)
           ((ulong)(((uint)GVar3 & 0xfffff) << 4) +
           *(long *)((long)p->ppObjs + (ulong)((uint)GVar3 >> 0x11 & 0x3ff8)));
  } while( true );
}

Assistant:

void Gia_ManAreCubeAddToTree_rec( Gia_ManAre_t * p, Gia_ObjAre_t * pObj, Gia_StaAre_t * pSta )
{
    if ( Gia_StaHasValue0(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch0(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj0(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F, pSta );
            if ( ++pObj->nStas0 == MAX_CUBE_NUM )
            {
                pObj->nStas0 = Gia_ManAreListCountListUsed( p, pObj->F[0] );
                if ( pObj->nStas0 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F );
                    pObj->nStas0 = 0;
                }
            }
        }
    }
    else if ( Gia_StaHasValue1(pSta, pObj->iVar) )
    {
        if ( Gia_ObjHasBranch1(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj1(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+1, pSta );
            if ( ++pObj->nStas1 == MAX_CUBE_NUM )
            {
                pObj->nStas1 = Gia_ManAreListCountListUsed( p, pObj->F[1] );
                if ( pObj->nStas1 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+1 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+1 );
                    pObj->nStas1 = 0;
                }
            }
        }
    }
    else
    {
        if ( Gia_ObjHasBranch2(pObj) )
            Gia_ManAreCubeAddToTree_rec( p, Gia_ObjNextObj2(p, pObj), pSta );
        else
        {
            Gia_ManAreCubeAddToList( p, pObj->F+2, pSta );
            if ( ++pObj->nStas2 == MAX_CUBE_NUM )
            {
                pObj->nStas2 = Gia_ManAreListCountListUsed( p, pObj->F[2] );
                if ( pObj->nStas2 < MAX_CUBE_NUM/2 )
                    Gia_ManAreCompress( p, pObj->F+2 );
                else
                {
                    Gia_ManAreRebalance( p, pObj->F+2 );
                    pObj->nStas2 = 0;
                }
            }
        }
    }
}